

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O3

bool fmp4_stream::set_track_id
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *moov_in,uint32_t track_id)

{
  int iVar1;
  size_t sVar2;
  uint uVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  long *local_50 [2];
  long local_40 [2];
  
  puVar4 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish + -0x10 != puVar4) {
    uVar3 = track_id >> 0x18 | (track_id & 0xff0000) >> 8 | (track_id & 0xff00) << 8 |
            track_id << 0x18;
    puVar5 = (pointer)0x0;
    do {
      puVar6 = puVar4 + (long)puVar5;
      local_50[0] = local_40;
      if (puVar4 == (pointer)0x0) {
        puVar4 = (pointer)0x1;
      }
      else {
        sVar2 = strlen((char *)puVar6);
        puVar4 = puVar6 + sVar2;
      }
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,puVar6,puVar4);
      iVar1 = std::__cxx11::string::compare((char *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      puVar4 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (iVar1 == 0) {
        *(uint *)(puVar5 + (long)(puVar4 + (ulong)(puVar5[(long)(puVar4 + 4)] == '\x01') * 8 + 0x10)
                 ) = uVar3;
LAB_00109151:
        local_50[0] = local_40;
        sVar2 = strlen((char *)(puVar5 + (long)puVar4));
        puVar6 = puVar5 + (long)(puVar4 + sVar2);
      }
      else {
        if (puVar4 != (pointer)0x0) goto LAB_00109151;
        puVar6 = (pointer)0x1;
        local_50[0] = local_40;
      }
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,puVar5 + (long)puVar4,puVar6);
      iVar1 = std::__cxx11::string::compare((char *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      puVar4 = (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (iVar1 == 0) {
        *(uint *)(puVar4 + (long)(puVar5 + (ulong)(puVar4[(long)(puVar5 + 4)] == '\x01') * 8 + 0x10)
                 ) = uVar3;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 < (moov_in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish + (-0x10 - (long)puVar4));
  }
  return true;
}

Assistant:

bool set_track_id(std::vector<uint8_t> &moov_in, uint32_t track_id)
	{
		bool set_tkhd = false;

		for (std::size_t k = 0; k < moov_in.size() - 16; k++)
		{
			if (std::string((char *)&moov_in[k]).compare("tkhd") == 0)
			{
				//cout << "tkhd found" << endl;
				if ((uint8_t)moov_in[k + 4] == 1)
				{
					// version 1 
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 24]);
					set_tkhd = true;
				}
				else {
					// version 0
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 16]);
					set_tkhd = true;
				}
			}
			if (std::string((char *)&moov_in[k]).compare("trex") == 0)
			{
				//cout << "tkhd found" << endl;
				if ((uint8_t)moov_in[k + 4] == 1)
				{
					// version 1 
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 24]);
					set_tkhd = true;
				}
				else {
					// version 0
					fmp4_write_uint32(track_id, (char*)&moov_in[k + 16]);
					set_tkhd = true;
				}
			}
		}
		return true;
	}